

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msc.h
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
msc::
mean_shift<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq,msc::kernels::ParabolicSq,msc::estimators::Constant>
          (undefined8 param_1,double param_2,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *__return_storage_ptr__,msc *this,
          __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
          first,int param_6,int dim)

{
  double dVar1;
  bool bVar2;
  invalid_argument *this_00;
  size_type __n;
  reference point_00;
  reference pvVar3;
  double *pdVar4;
  reference pvVar5;
  double *b;
  bool local_141;
  undefined1 local_d0 [8];
  vector<double,_std::allocator<double>_> point;
  double d;
  int iter;
  double *pt_1;
  size_t i_1;
  int local_8c;
  int k;
  double *pt;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  it;
  size_t i;
  vector<double,_std::allocator<double>_> *local_68;
  msc *local_60;
  undefined1 local_55;
  int local_44;
  double dStack_40;
  int max_iter_local;
  double epsilon_local;
  undefined8 uStack_30;
  int dim_local;
  Constant estimator_local;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_20;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  last_local;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  first_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *shifted;
  
  local_44 = dim;
  dStack_40 = param_2;
  epsilon_local._4_4_ = param_6;
  uStack_30 = param_1;
  local_20._M_current = first._M_current;
  last_local._M_current = (vector<double,_std::allocator<double>_> *)this;
  if (0 < param_6) {
    local_55 = 0;
    local_68 = first._M_current;
    local_60 = this;
    __n = std::
          distance<__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>>
                    ((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                      )this,first);
    std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&i + 7));
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(__return_storage_ptr__,__n,
             (allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&i + 7));
    std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&i + 7));
    it._M_current = (vector<double,_std::allocator<double>_> *)0x0;
    pt = (double *)last_local._M_current;
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                               *)&pt,&local_20), bVar2) {
      point_00 = __gnu_cxx::
                 __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                              *)&pt);
      pdVar4 = Accessor<double,_std::vector<double,_std::allocator<double>_>_>::data(point_00);
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](__return_storage_ptr__,(size_type)it._M_current);
      std::vector<double,_std::allocator<double>_>::resize(pvVar5,(long)epsilon_local._4_4_);
      for (local_8c = 0; local_8c < epsilon_local._4_4_; local_8c = local_8c + 1) {
        dVar1 = pdVar4[local_8c];
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](__return_storage_ptr__,(size_type)it._M_current);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_8c);
        *pvVar3 = dVar1;
      }
      __gnu_cxx::
      __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
      ::operator++((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&pt,0);
      it._M_current =
           (vector<double,_std::allocator<double>_> *)
           ((long)&((it._M_current)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start + 1);
    }
    for (pt_1 = (double *)0x0;
        pdVar4 = (double *)
                 std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::size(__return_storage_ptr__), pt_1 < pdVar4; pt_1 = (double *)((long)pt_1 + 1)) {
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](__return_storage_ptr__,(size_type)pt_1);
      pdVar4 = std::vector<double,_std::allocator<double>_>::data(pvVar5);
      d._4_4_ = 0;
      point.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      do {
        mean_shift<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq,msc::kernels::ParabolicSq,msc::estimators::Constant>
                  (uStack_30,(msc *)local_d0,pdVar4,last_local._M_current,local_20._M_current,
                   epsilon_local._4_4_);
        b = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)local_d0);
        point.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)metrics::L2Sq::operator()
                                ((L2Sq *)((long)&estimator_local.factor_ + 7),pdVar4,b,
                                 epsilon_local._4_4_);
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](__return_storage_ptr__,(size_type)pt_1);
        std::vector<double,_std::allocator<double>_>::operator=
                  (pvVar5,(vector<double,_std::allocator<double>_> *)local_d0);
        d._4_4_ = d._4_4_ + 1;
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_d0);
        local_141 = dStack_40 <
                    (double)point.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage && d._4_4_ < local_44;
      } while (local_141);
    }
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Dimension must be greater than 0");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline std::vector<std::vector<T>> mean_shift(
    ForwardIterator first, ForwardIterator last, int dim,
    Metric metric, Kernel kernel, Estimator estimator,
    double epsilon = std::numeric_limits<float>::epsilon(),
    int max_iter = std::numeric_limits<int>::max())
{
    if (dim <= 0)
        throw std::invalid_argument("Dimension must be greater than 0");
    typedef typename std::iterator_traits<ForwardIterator>::value_type C;
    std::vector<std::vector<T>> shifted(std::distance(first, last));
    std::size_t i = 0;
    for (auto it = first; it != last; it++, i++)
    {
        const T* pt = Accessor<T, C>::data(*it);
        shifted[i].resize(dim);
        for (int k = 0; k < dim; k++)
            shifted[i][k] = pt[k];
    }

    #pragma omp parallel for
    for (std::size_t i = 0; i < shifted.size(); i++)
    {
        const T* pt = shifted[i].data();
        int iter = 0;
        double d = 0;
        do
        {
            const auto point = mean_shift(
                pt, first, last, dim, metric, kernel, estimator);
            d = metric(pt, point.data(), dim);
            shifted[i] = point;
            iter++;
        }
        while (d > epsilon && iter < max_iter);
    }

    return shifted;
}